

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

int __thiscall QByteArray::toInt(QByteArray *this,bool *ok,int base)

{
  QLocaleData *this_00;
  int iVar1;
  int in_ECX;
  undefined4 in_register_00000014;
  bool bVar2;
  QSimpleParsedNumber<long_long> QVar3;
  QByteArrayView num;
  
  num.m_data._4_4_ = in_register_00000014;
  num.m_data._0_4_ = base;
  this_00 = (QLocaleData *)(this->d).size;
  bVar2 = true;
  iVar1 = 0;
  if (this_00 != (QLocaleData *)0x0) {
    num.m_size = (qsizetype)(this->d).ptr;
    QVar3 = QLocaleData::bytearrayToLongLong(this_00,num,in_ECX);
    iVar1 = 0;
    if (0 < QVar3.used) {
      iVar1 = (int)QVar3.result;
      bVar2 = (long)iVar1 != QVar3.result;
    }
  }
  if (ok != (bool *)0x0) {
    *ok = (bool)(bVar2 ^ 1);
  }
  if (bVar2) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int QByteArray::toInt(bool *ok, int base) const
{
    return QtPrivate::toIntegral<int>(qToByteArrayViewIgnoringNull(*this), ok, base);
}